

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint8_t uVar1;
  bool bVar2;
  int32_t iVar3;
  charls_interleave_mode cVar4;
  _Bool _Var5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  uint8_t *triplet_buffer;
  uint *puVar8;
  void *buffer;
  charls_interleave_mode unaff_EBP;
  char *pcVar9;
  uint8_t *puVar10;
  char *__format;
  long lVar11;
  size_t column;
  long lVar12;
  char *unaff_R13;
  uint unaff_R14D;
  bmp_dib_header_t dib_header;
  bmp_header_t header;
  size_t stride;
  size_t encoded_size;
  bmp_dib_header_t local_80;
  char local_58;
  char local_57;
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  uint32_t local_4c;
  char *local_48;
  size_t local_40;
  size_t local_38;
  
  if (argc < 3) {
    pcVar9 = 
    "Usage: <input-filename> <output-filename> [interleave-mode (none, line or sample), default = none] [near-lossless, default=0 (lossless)]"
    ;
  }
  else {
    unaff_R13 = argv[1];
    local_48 = argv[2];
    unaff_R14D = 0;
    cVar4 = CHARLS_INTERLEAVE_MODE_NONE;
    if (argc != 3) {
      pcVar9 = argv[3];
      iVar6 = strcmp(pcVar9,"none");
      unaff_EBP = CHARLS_INTERLEAVE_MODE_NONE;
      cVar4 = CHARLS_INTERLEAVE_MODE_NONE;
      if (iVar6 != 0) {
        iVar6 = strcmp(pcVar9,"line");
        if (iVar6 == 0) {
          cVar4 = CHARLS_INTERLEAVE_MODE_LINE;
        }
        else {
          iVar6 = strcmp(pcVar9,"sample");
          if (iVar6 != 0) {
            pcVar9 = "Argument interleave-mode needs to be: none, line or sample";
            unaff_R14D = 0;
            goto LAB_00104999;
          }
          cVar4 = CHARLS_INTERLEAVE_MODE_SAMPLE;
        }
      }
    }
    unaff_EBP = cVar4;
    bVar2 = true;
    if (argc < 5) goto LAB_00104a49;
    lVar11 = strtol(argv[4],(char **)0x0,10);
    unaff_R14D = (uint)lVar11;
    if (unaff_R14D < 0x100) goto LAB_00104a49;
    pcVar9 = "Argument near-lossless needs to be in the range [0,255]";
  }
LAB_00104999:
  puts(pcVar9);
  bVar2 = false;
LAB_00104a49:
  if (!bVar2) {
    return 1;
  }
  __stream = fopen(unaff_R13,"rb");
  if (__stream == (FILE *)0x0) {
    puVar8 = (uint *)__errno_location();
    printf("Failed to open file: %s, errno: %d\n",unaff_R13,(ulong)*puVar8);
    return 1;
  }
  sVar7 = fread(&local_58,2,1,__stream);
  if (((((((sVar7 == 0) || (sVar7 = fread(local_54,4,1,__stream), sVar7 == 0)) ||
         (sVar7 = fread(local_50,4,1,__stream), sVar7 == 0)) ||
        ((sVar7 = fread(&local_4c,4,1,__stream), sVar7 == 0 || (local_58 != 'B')))) ||
       (((local_57 != 'M' ||
         ((sVar7 = fread(&local_80,4,1,__stream), sVar7 == 0 || (local_80.header_size < 0x28)))) ||
        (sVar7 = fread(&local_80.width,4,1,__stream), sVar7 == 0)))) ||
      ((((sVar7 = fread(&local_80.height,4,1,__stream), sVar7 == 0 ||
         (sVar7 = fread(&local_80.number_planes,2,1,__stream), sVar7 == 0)) ||
        (sVar7 = fread(&local_80.depth,2,1,__stream), sVar7 == 0)) ||
       (((sVar7 = fread(&local_80.compress_type,4,1,__stream), sVar7 == 0 ||
         (sVar7 = fread(&local_80.bmp_byte_size,4,1,__stream), sVar7 == 0)) ||
        ((sVar7 = fread(&local_80.horizontal_resolution,4,1,__stream), sVar7 == 0 ||
         ((sVar7 = fread(&local_80.vertical_resolution,4,1,__stream), sVar7 == 0 ||
          (sVar7 = fread(&local_80.number_colors,4,1,__stream), sVar7 == 0)))))))))) ||
     (sVar7 = fread(&local_80.number_important_colors,4,1,__stream), sVar7 == 0)) {
    printf("Failed to read the BMP info from the file: %s\n",argv[1]);
  }
  else {
    if ((local_80.compress_type == 0) && (local_80.depth == 0x18)) {
      if ((local_80.width != 0) && (local_80.height != 0)) {
        triplet_buffer =
             (uint8_t *)bmp_read_pixel_data((FILE *)__stream,local_4c,&local_80,&local_40);
        fclose(__stream);
        if (triplet_buffer == (uint8_t *)0x0) {
          pcVar9 = argv[1];
          __format = "Failed to read the BMP pixel data from the file: %s\n";
        }
        else {
          if ((long)local_80.height < 1) {
            iVar3 = -local_80.height;
            if (0 < local_80.height) {
              iVar3 = local_80.height;
            }
          }
          else {
            _Var5 = convert_bottom_up_to_top_down
                              (triplet_buffer,(ulong)local_80.width,(long)local_80.height,local_40);
            iVar3 = local_80.height;
            if (!_Var5) {
              puts("Failed to convert the pixels from bottom up to top down");
              return 1;
            }
          }
          local_80.height = iVar3;
          if ((long)local_80.height != 0) {
            puVar10 = triplet_buffer + 2;
            lVar11 = 0;
            do {
              if (local_80.width != 0) {
                lVar12 = 0;
                do {
                  uVar1 = puVar10[lVar12 + -2];
                  puVar10[lVar12 + -2] = puVar10[lVar12];
                  puVar10[lVar12] = uVar1;
                  lVar12 = lVar12 + 3;
                } while ((ulong)local_80.width * 3 != lVar12);
              }
              lVar11 = lVar11 + 1;
              puVar10 = puVar10 + local_40;
            } while (lVar11 != local_80.height);
          }
          buffer = encode_bmp_to_jpegls
                             (triplet_buffer,local_40,&local_80,unaff_EBP,unaff_R14D,&local_38);
          free(triplet_buffer);
          if (buffer == (void *)0x0) {
            return 1;
          }
          _Var5 = save_jpegls_file(local_48,buffer,local_38);
          free(buffer);
          if (_Var5) {
            return 0;
          }
          __format = "Failed to write encoded data to the file: %s\n";
          pcVar9 = local_48;
        }
        printf(__format,pcVar9);
        return 1;
      }
      pcVar9 = "Can only process an image that is 1 x 1 or bigger";
    }
    else {
      pcVar9 = "Can only convert uncompressed 24 bits BMP files";
    }
    printf(pcVar9);
  }
  fclose(__stream);
  return 1;
}

Assistant:

int main(const int argc, char* argv[])
{
    options_t options;
    if (!parse_command_line_options(argc, argv, &options))
        return EXIT_FAILURE;

    FILE* input_stream = fopen(options.input_filename, "rb");
    if (!input_stream)
    {
        printf("Failed to open file: %s, errno: %d\n", options.input_filename, errno);
        return EXIT_FAILURE;
    }

    bmp_header_t header;
    bmp_dib_header_t dib_header;
    if (!bmp_read_header(input_stream, &header) || !bmp_read_dib_header(input_stream, &dib_header))
    {
        printf("Failed to read the BMP info from the file: %s\n", argv[1]);
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.compress_type != 0 || dib_header.depth != 24)
    {
        printf("Can only convert uncompressed 24 bits BMP files");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    if (dib_header.width == 0 || dib_header.height == 0)
    {
        printf("Can only process an image that is 1 x 1 or bigger");
        (void) fclose(input_stream);
        return EXIT_FAILURE;
    }

    size_t stride;
    void* pixel_data = bmp_read_pixel_data(input_stream, header.offset, &dib_header, &stride);
    (void ) fclose(input_stream);

    if (!pixel_data)
    {
        printf("Failed to read the BMP pixel data from the file: %s\n", argv[1]);
        return EXIT_FAILURE;
    }

    // Pixels in the BMP file format are stored bottom up (when the height parameter is positive), JPEG-LS requires top down.
    if (dib_header.height > 0)
    {
        if (!convert_bottom_up_to_top_down(pixel_data, dib_header.width, (size_t)dib_header.height, stride))
        {
            printf("Failed to convert the pixels from bottom up to top down\n");
            return EXIT_FAILURE;
        }
    }
    else
    {
        dib_header.height = abs(dib_header.height);
    }

    // Pixels in the BMP file format are stored as BGR. JPEG-LS (SPIFF header) only supports the RGB color model.
    // Note: without the optional SPIFF header no color information is stored in the JPEG-LS file and the common assumption
    // is RGB.
    convert_bgr_to_rgb(pixel_data, dib_header.width, (size_t)dib_header.height, stride);

    size_t encoded_size;
    void* encoded_data =
        encode_bmp_to_jpegls(pixel_data, stride, &dib_header, options.interleave_mode, options.near_lossless, &encoded_size);
    free(pixel_data);
    if (!encoded_data)
        return EXIT_FAILURE; // error already printed.

    const bool result = save_jpegls_file(options.output_filename, encoded_data, encoded_size);
    free(encoded_data);
    if (!result)
    {
        printf("Failed to write encoded data to the file: %s\n", options.output_filename);
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}